

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  uint local_944;
  spirv_cross local_940 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [8];
  string bitcast_op_3;
  char *local_900;
  undefined1 local_8f8 [40];
  string store_expr_3;
  uint local_8b8;
  uint local_8b4;
  uint32_t c_1;
  uint32_t r_1;
  spirv_cross local_890 [32];
  undefined1 local_870 [8];
  SPIRType scalar_type_1;
  spirv_cross local_718 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8 [8];
  string bitcast_op_2;
  undefined1 local_6d8 [40];
  string store_expr_2;
  uint local_694;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [4];
  uint32_t c;
  spirv_cross local_670 [32];
  undefined1 local_650 [8];
  SPIRType vector_type;
  string local_4f8 [32];
  char *local_4d8;
  char *store_op_1;
  spirv_cross local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [8];
  string bitcast_op_1;
  undefined1 local_488 [8];
  string store_expr_1;
  uint local_464;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460 [4];
  uint32_t r;
  spirv_cross local_440 [32];
  undefined1 local_420 [8];
  SPIRType scalar_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [8];
  string bitcast_op;
  undefined1 local_290 [8];
  string store_expr;
  allocator local_269;
  string local_268 [32];
  char *local_248;
  char *store_op;
  spirv_cross local_220 [32];
  string local_200 [8];
  string template_expr;
  string local_1d8 [8];
  string base;
  allocator local_1b1;
  string local_1b0 [5];
  bool templated_store;
  char local_190 [16];
  undefined1 local_180 [8];
  SPIRType target_type;
  SPIRType *type;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  uint32_t value_local;
  SPIRAccessChain *chain_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar2);
  SPIRType::SPIRType((SPIRType *)local_180);
  target_type.super_IVariant._vptr_IVariant._4_4_ = 8;
  target_type.super_IVariant._12_4_ =
       *(undefined4 *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
  target_type.width = *(uint32_t *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) == 0xf) {
      write_access_chain_struct(this,chain,value,composite_chain);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
      Compiler::register_write((Compiler *)this,uVar2);
      local_190[0] = '\x01';
      local_190[1] = '\0';
      local_190[2] = '\0';
      local_190[3] = '\0';
    }
    else {
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt != 0x20) &&
         (((this->hlsl_options).enable_16bit_types & 1U) == 0)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b0,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                   ,&local_1b1);
        CompilerError::CompilerError(pCVar3,(string *)local_1b0);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar6 = 0x3d < (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string(local_1d8,(string *)&chain->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_1d8,uVar2);
      }
      ::std::__cxx11::string::string(local_200);
      if (bVar6) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&store_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (local_220,(char (*) [2])0x5e6cd2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&store_op,
                   (char (*) [2])0x5f0ee9);
        ::std::__cxx11::string::operator=(local_200,(string *)local_220);
        ::std::__cxx11::string::~string((string *)local_220);
        ::std::__cxx11::string::~string((string *)&store_op);
      }
      bVar1 = SUB81(composite_chain,0);
      uVar2 = (uint32_t)this;
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) &&
         ((chain->row_major_matrix & 1U) == 0)) {
        local_248 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_248 = "Store";
          break;
        case 2:
          local_248 = "Store2";
          break;
        case 3:
          local_248 = "Store3";
          break;
        case 4:
          local_248 = "Store4";
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_268,"Unknown vector size.",&local_269);
          CompilerError::CompilerError(pCVar3,(string *)local_268);
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        write_access_chain_value_abi_cxx11_
                  ((CompilerHLSL *)local_290,uVar2,(SmallVector<unsigned_int,_8UL> *)(ulong)value,
                   bVar1);
        if (bVar6) {
          local_248 = "Store";
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                    (local_2b0,this,local_180,target_type.member_name_cache._M_h._M_single_bucket);
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      ((spirv_cross *)&scalar_type.member_name_cache._M_h._M_single_bucket,local_2b0
                       ,(char (*) [2])0x601bd3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290,(char (*) [2])0x5eaa1a);
            ::std::__cxx11::string::operator=
                      ((string *)local_290,
                       (string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string
                      ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
          }
          ::std::__cxx11::string::~string((string *)local_2b0);
        }
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   (char (*) [2])0x5ea727,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   (char (*) [2])0x601bd3,&chain->dynamic_index,&chain->static_index,
                   (char (*) [3])0x5fe6df,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   (char (*) [3])0x5e9b6f);
        ::std::__cxx11::string::~string((string *)local_290);
      }
      else if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) {
        if (bVar6) {
          SPIRType::SPIRType((SPIRType *)local_420,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.super_IVariant._12_4_ = 1;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_460,this,local_420,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_440,(char (*) [2])0x5e6cd2,local_460,(char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_200,(string *)local_440);
          ::std::__cxx11::string::~string((string *)local_440);
          ::std::__cxx11::string::~string((string *)local_460);
          SPIRType::~SPIRType((SPIRType *)local_420);
        }
        for (local_464 = 0;
            local_464 <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
            local_464 = local_464 + 1) {
          write_access_chain_value_abi_cxx11_
                    ((CompilerHLSL *)local_488,uVar2,(SmallVector<unsigned_int,_8UL> *)(ulong)value,
                     bVar1);
          if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4
                           )) {
            ::std::__cxx11::string::operator+=((string *)local_488,".");
            pcVar4 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,local_464);
            ::std::__cxx11::string::operator+=((string *)local_488,pcVar4);
          }
          CompilerGLSL::remove_duplicate_swizzle(&this->super_CompilerGLSL,(string *)local_488);
          if (!bVar6) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                      (local_4a8,this,local_180,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (local_4c8,local_4a8,(char (*) [2])0x601bd3,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488,(char (*) [2])0x5eaa1a);
              ::std::__cxx11::string::operator=((string *)local_488,(string *)local_4c8);
              ::std::__cxx11::string::~string((string *)local_4c8);
            }
            ::std::__cxx11::string::~string((string *)local_4a8);
          }
          store_op_1._4_4_ = chain->static_index + chain->matrix_stride * local_464;
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     (char (*) [7])".Store",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     (char (*) [2])0x601bd3,&chain->dynamic_index,(uint *)((long)&store_op_1 + 4),
                     (char (*) [3])0x5fe6df,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                     (char (*) [3])0x5e9b6f);
          ::std::__cxx11::string::~string((string *)local_488);
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        local_4d8 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_4d8 = "Store";
          break;
        case 2:
          local_4d8 = "Store2";
          break;
        case 3:
          local_4d8 = "Store3";
          break;
        case 4:
          local_4d8 = "Store4";
          break;
        default:
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_4f8,"Unknown vector size.",
                     (allocator *)((long)&vector_type.member_name_cache._M_h._M_single_bucket + 7));
          CompilerError::CompilerError(pCVar3,(string *)local_4f8);
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar6) {
          local_4d8 = "Store";
          SPIRType::SPIRType((SPIRType *)local_650,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_690,this,local_650,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_670,(char (*) [2])0x5e6cd2,local_690,(char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_200,(string *)local_670);
          ::std::__cxx11::string::~string((string *)local_670);
          ::std::__cxx11::string::~string((string *)local_690);
          SPIRType::~SPIRType((SPIRType *)local_650);
        }
        for (local_694 = 0;
            local_694 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_694 = local_694 + 1) {
          write_access_chain_value_abi_cxx11_
                    ((CompilerHLSL *)local_6d8,uVar2,(SmallVector<unsigned_int,_8UL> *)(ulong)value,
                     bVar1);
          join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((spirv_cross *)(local_6d8 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8,
                     (char (*) [2])0x5ee639,&local_694,(char (*) [2])0x5ee53e);
          ::std::__cxx11::string::~string((string *)local_6d8);
          if (!bVar6) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                      (local_6f8,this,local_180,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (local_718,local_6f8,(char (*) [2])0x601bd3,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_6d8 + 0x20),(char (*) [2])0x5eaa1a);
              ::std::__cxx11::string::operator=((string *)(local_6d8 + 0x20),(string *)local_718);
              ::std::__cxx11::string::~string((string *)local_718);
            }
            ::std::__cxx11::string::~string((string *)local_6f8);
          }
          scalar_type_1.member_name_cache._M_h._M_single_bucket._4_4_ =
               chain->static_index + local_694 * chain->matrix_stride;
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     (char (*) [2])0x5ea727,&local_4d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     (char (*) [2])0x601bd3,&chain->dynamic_index,
                     (uint *)((long)&scalar_type_1.member_name_cache._M_h._M_single_bucket + 4),
                     (char (*) [3])0x5fe6df,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_6d8 + 0x20),(char (*) [3])0x5e9b6f);
          ::std::__cxx11::string::~string((string *)(local_6d8 + 0x20));
        }
      }
      else {
        if (bVar6) {
          SPIRType::SPIRType((SPIRType *)local_870,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.super_IVariant._12_4_ = 1;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&c_1,this,local_870,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_890,(char (*) [2])0x5e6cd2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1,
                     (char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_200,(string *)local_890);
          ::std::__cxx11::string::~string((string *)local_890);
          ::std::__cxx11::string::~string((string *)&c_1);
          SPIRType::~SPIRType((SPIRType *)local_870);
        }
        for (local_8b4 = 0;
            local_8b4 <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
            local_8b4 = local_8b4 + 1) {
          for (local_8b8 = 0;
              local_8b8 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
              local_8b8 = local_8b8 + 1) {
            write_access_chain_value_abi_cxx11_
                      ((CompilerHLSL *)local_8f8,uVar2,
                       (SmallVector<unsigned_int,_8UL> *)(ulong)value,bVar1);
            local_900 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,local_8b4);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                      ((spirv_cross *)(local_8f8 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8f8,(char (*) [2])0x5ee639,&local_8b8,(char (*) [3])0x5eae87,&local_900
                      );
            ::std::__cxx11::string::~string((string *)local_8f8);
            CompilerGLSL::remove_duplicate_swizzle
                      (&this->super_CompilerGLSL,(string *)(local_8f8 + 0x20));
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                      (local_920,this,local_180,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (local_940,local_920,(char (*) [2])0x601bd3,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_8f8 + 0x20),(char (*) [2])0x5eaa1a);
              ::std::__cxx11::string::operator=((string *)(local_8f8 + 0x20),(string *)local_940);
              ::std::__cxx11::string::~string((string *)local_940);
            }
            local_944 = chain->static_index +
                        local_8b8 *
                        (*(uint *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt >>
                        3) + local_8b4 * chain->matrix_stride;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,(char (*) [7])".Store",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200,(char (*) [2])0x601bd3,&chain->dynamic_index,&local_944,
                       (char (*) [3])0x5fe6df,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_8f8 + 0x20),(char (*) [3])0x5e9b6f);
            ::std::__cxx11::string::~string((string *)local_920);
            ::std::__cxx11::string::~string((string *)(local_8f8 + 0x20));
          }
        }
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
      Compiler::register_write((Compiler *)this,uVar2);
      ::std::__cxx11::string::~string(local_200);
      ::std::__cxx11::string::~string(local_1d8);
      local_190[0] = '\0';
      local_190[1] = '\0';
      local_190[2] = '\0';
      local_190[3] = '\0';
    }
  }
  else {
    write_access_chain_array(this,chain,value,composite_chain);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
    Compiler::register_write((Compiler *)this,uVar2);
    local_190[0] = '\x01';
    local_190[1] = '\0';
    local_190[2] = '\0';
    local_190[3] = '\0';
  }
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}